

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O0

double __thiscall Alg::max_cover_topk(Alg *this,int targetSize)

{
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_00;
  allocator<unsigned_int> *paVar1;
  size_t sVar2;
  uint uVar3;
  value_type vVar4;
  uint uVar5;
  uint uVar6;
  value_type vVar7;
  size_type __n;
  unsigned_long uVar8;
  bool bVar9;
  reference pvVar10;
  pointer pvVar11;
  reference pvVar12;
  reference pvVar13;
  reference this_01;
  reference pvVar14;
  reference puVar15;
  reference puVar16;
  reference __b;
  ostream *poVar17;
  uint uVar18;
  size_type sVar19;
  long lVar20;
  ulong __n_00;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  reference rVar28;
  double finalInf;
  value_type startNode;
  value_type startPos;
  value_type currDeg;
  value_type currPos;
  uint nodeIdx;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  _Bit_type local_1c0;
  reference local_1b8;
  size_type local_1a8;
  unsigned_long edgeIdx;
  iterator __end2_1;
  iterator __begin2_1;
  value_type *__range2_1;
  size_type newNumV;
  value_type seed;
  int k;
  size_t sumInf;
  size_t deg_1;
  size_t sumTopk;
  undefined1 local_158 [8];
  vector<bool,_std::allocator<bool>_> edgeMark;
  uint *node;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *nodes;
  iterator __end1;
  iterator __begin1;
  RRsets *__range1;
  size_t idxDegree;
  uint32_t idxSort;
  Nodelist degreePosition;
  undefined1 local_c0 [8];
  Nodelist nodePosition;
  undefined1 local_a0 [8];
  Nodelist sortedNode;
  uint32_t i_1;
  RRsets degMap;
  size_type deg;
  pointer pvStack_58;
  uint32_t i;
  size_t maxDeg;
  allocator<unsigned_long> local_39;
  value_type_conflict2 local_38;
  undefined1 local_30 [8];
  FRset coverage;
  int targetSize_local;
  Alg *this_local;
  
  uVar18 = this->__numV;
  local_38 = 0;
  coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = targetSize;
  std::allocator<unsigned_long>::allocator(&local_39);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,(ulong)uVar18,
             &local_38,&local_39);
  std::allocator<unsigned_long>::~allocator(&local_39);
  pvStack_58 = (pointer)0x0;
  deg._4_4_ = this->__numV;
  while (uVar18 = deg._4_4_ - 1, deg._4_4_ != 0) {
    pvVar10 = std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::operator[](&(this->__hyperG)._FRsets,(ulong)uVar18);
    pvVar11 = (pointer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar10);
    degMap.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar11;
    pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,
                         (ulong)uVar18);
    *pvVar12 = (value_type)pvVar11;
    deg._4_4_ = uVar18;
    if (pvStack_58 <
        degMap.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pvStack_58 = degMap.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
  this_00 = (allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
            ((long)&sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator(this_00);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)&i_1,(size_type)
                   ((long)&(pvStack_58->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start + 1),this_00);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = this->__numV;
  while (uVar18 = (uint)sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage - 1,
        (uint)sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != 0) {
    sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = uVar18;
    pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,
                         (ulong)uVar18);
    pvVar13 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)&i_1,*pvVar12);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (pvVar13,(value_type_conflict *)
                       &sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  uVar3 = this->__numV;
  paVar1 = (allocator<unsigned_int> *)
           ((long)&nodePosition.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = uVar18;
  std::allocator<unsigned_int>::allocator(paVar1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,(ulong)uVar3,paVar1);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&nodePosition.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  uVar18 = this->__numV;
  paVar1 = (allocator<unsigned_int> *)
           ((long)&degreePosition.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(paVar1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0,(ulong)uVar18,paVar1);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&degreePosition.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&idxDegree + 7));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxSort,
             (size_type)
             ((long)&(pvStack_58->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start + 2),
             (allocator<unsigned_int> *)((long)&idxDegree + 7));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&idxDegree + 7));
  idxDegree._0_4_ = 0;
  __range1 = (RRsets *)0x0;
  __end1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)&i_1);
  nodes = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)&i_1);
  while (bVar9 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                     *)&nodes), bVar9) {
    this_01 = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator*(&__end1);
    pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxSort,
                         (size_type)__range1);
    vVar4 = *pvVar14;
    sVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_01);
    pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxSort,
                         (size_type)
                         ((long)&(__range1->
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1));
    *pvVar14 = vVar4 + (int)sVar19;
    __range1 = (RRsets *)
               ((long)&(__range1->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_01);
    node = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_01);
    while (bVar9 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)&node), bVar9) {
      edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage =
           (_Bit_pointer)
           __gnu_cxx::
           __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           ::operator*(&__end2);
      vVar4 = (value_type)idxDegree;
      pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0,
                           (ulong)(uint)*edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl
                                         .super__Bvector_impl_data._M_end_of_storage);
      *pvVar14 = vVar4;
      uVar8 = *edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage;
      __n_00 = (ulong)(value_type)idxDegree;
      idxDegree._0_4_ = (value_type)idxDegree + 1;
      pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,__n_00);
      *pvVar14 = (value_type)uVar8;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end1);
  }
  sVar19 = this->__numRRsets;
  sumTopk._7_1_ = 0;
  std::allocator<bool>::allocator((allocator<bool> *)((long)&sumTopk + 6));
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_158,sVar19,(bool *)((long)&sumTopk + 7),
             (allocator<bool> *)((long)&sumTopk + 6));
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&sumTopk + 6));
  deg_1 = 0;
  sumInf = (long)&(pvStack_58->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start + 1;
  do {
    sVar19 = sumInf - 1;
    bVar9 = sumInf == 0;
    sumInf = sVar19;
    if (bVar9) {
LAB_0010743c:
      auVar25._8_4_ = (int)(deg_1 >> 0x20);
      auVar25._0_8_ = deg_1;
      auVar25._12_4_ = 0x45300000;
      this->__boundMin =
           ((auVar25._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)deg_1) - 4503599627370496.0)) * 1.0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->__vecSeed);
      _seed = 0;
      newNumV._4_4_ =
           coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
      while (newNumV._4_4_ != 0) {
        newNumV._4_4_ = newNumV._4_4_ + -1;
        pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0);
        newNumV._0_4_ = *pvVar14;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0);
        sVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0);
        pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,
                             sVar19 - (long)coverage.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                            );
        pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,
                             (ulong)*pvVar14);
        vVar7 = *pvVar12;
        pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,
                             (ulong)(value_type)newNumV);
        deg_1 = deg_1 + (vVar7 - *pvVar12);
        pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,
                             (ulong)(value_type)newNumV);
        _seed = _seed + *pvVar12;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->__vecSeed,(value_type_conflict *)&newNumV);
        pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,
                             (ulong)(value_type)newNumV);
        *pvVar12 = 0;
        pvVar10 = std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::operator[](&(this->__hyperG)._FRsets,(ulong)(value_type)newNumV);
        __end2_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvVar10);
        edgeIdx = (unsigned_long)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pvVar10);
        while( true ) {
          bVar9 = __gnu_cxx::operator!=
                            (&__end2_1,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)&edgeIdx);
          if (!bVar9) break;
          puVar15 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&__end2_1);
          local_1a8 = *puVar15;
          rVar28 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_158,local_1a8);
          local_1b8 = rVar28;
          bVar9 = std::_Bit_reference::operator_cast_to_bool(&local_1b8);
          if (!bVar9) {
            rVar28 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_158,local_1a8);
            local_1c0 = rVar28._M_mask;
            __range3 = (value_type *)rVar28._M_p;
            std::_Bit_reference::operator=((_Bit_reference *)&__range3,true);
            pvVar13 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[](&(this->__hyperG)._RRsets,local_1a8);
            __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar13);
            _currPos = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar13);
            while( true ) {
              bVar9 = __gnu_cxx::operator!=
                                (&__end3,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                          *)&currPos);
              if (!bVar9) break;
              puVar16 = __gnu_cxx::
                        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator*(&__end3);
              uVar18 = *puVar16;
              pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30
                                   ,(ulong)uVar18);
              if (*pvVar12 != 0) {
                pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0
                                     ,(ulong)uVar18);
                uVar3 = *pvVar14;
                pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     local_30,(ulong)uVar18);
                __n = *pvVar12;
                pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxSort
                                     ,__n);
                uVar5 = *pvVar14;
                pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0
                                     ,(ulong)uVar5);
                uVar6 = *pvVar14;
                pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0
                                     ,(ulong)uVar3);
                __b = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,
                                 (ulong)uVar5);
                std::swap<unsigned_int>(pvVar14,__b);
                pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0
                                     ,(ulong)uVar18);
                *pvVar14 = uVar5;
                pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0
                                     ,(ulong)uVar6);
                *pvVar14 = uVar3;
                pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxSort
                                     ,__n);
                *pvVar14 = *pvVar14 + 1;
                pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     local_30,(ulong)uVar18);
                *pvVar12 = *pvVar12 - 1;
                if (sVar19 - (long)coverage.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <=
                    (ulong)uVar5) {
                  deg_1 = deg_1 - 1;
                }
              }
              __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(&__end3);
            }
          }
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&__end2_1);
        }
        lVar20 = _seed + deg_1;
        auVar26._8_4_ = (int)((ulong)lVar20 >> 0x20);
        auVar26._0_8_ = lVar20;
        auVar26._12_4_ = 0x45300000;
        this->__boundLast =
             ((auVar26._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0)) * 1.0;
        if (this->__boundLast <= this->__boundMin && this->__boundMin != this->__boundLast) {
          this->__boundMin = this->__boundLast;
        }
      }
      sVar2 = this->__numRRsets;
      auVar22._8_4_ = (int)(sVar2 >> 0x20);
      auVar22._0_8_ = sVar2;
      auVar22._12_4_ = 0x45300000;
      this->__boundMin =
           this->__boundMin *
           ((double)this->__numV /
           ((auVar22._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)));
      sVar2 = this->__numRRsets;
      auVar23._8_4_ = (int)(sVar2 >> 0x20);
      auVar23._0_8_ = sVar2;
      auVar23._12_4_ = 0x45300000;
      this->__boundLast =
           this->__boundLast *
           ((double)this->__numV /
           ((auVar23._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)));
      auVar24._8_4_ = (int)((ulong)_seed >> 0x20);
      auVar24._0_8_ = _seed;
      auVar24._12_4_ = 0x45300000;
      sVar2 = this->__numRRsets;
      auVar27._8_4_ = (int)(sVar2 >> 0x20);
      auVar27._0_8_ = sVar2;
      auVar27._12_4_ = 0x45300000;
      dVar21 = (((auVar24._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)_seed) - 4503599627370496.0)) *
               (double)this->__numV) /
               ((auVar27._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
      newNumV._4_4_ = newNumV._4_4_ + -1;
      poVar17 = std::operator<<((ostream *)&std::cout,"  >>>[greedy-topk] influence: ");
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,dVar21);
      poVar17 = std::operator<<(poVar17,", min-bound: ");
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,this->__boundMin);
      poVar17 = std::operator<<(poVar17,", last-bound: ");
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,this->__boundLast);
      std::operator<<(poVar17,'\n');
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_158);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxSort);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)&i_1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
      return dVar21;
    }
    pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxSort,sVar19);
    sVar2 = sumInf;
    if (*pvVar14 <=
        this->__numV -
        coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_) {
      pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxSort,
                           sumInf + 1);
      deg_1 = sVar2 * (*pvVar14 -
                      (this->__numV -
                      coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) + deg_1;
      goto LAB_0010743c;
    }
    pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxSort,sumInf + 1)
    ;
    vVar4 = *pvVar14;
    pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxSort,sumInf);
    deg_1 = sVar2 * (vVar4 - *pvVar14) + deg_1;
  } while( true );
}

Assistant:

double Alg::max_cover_topk(const int targetSize)
{
    FRset coverage(__numV, 0);
    size_t maxDeg = 0;
    for (auto i = __numV; i--;)
    {
        const auto deg = __hyperG._FRsets[i].size();
        coverage[i] = deg;
        if (deg > maxDeg) maxDeg = deg;
    }
    RRsets degMap(maxDeg + 1); // degMap: map degree to the nodes with this degree
    for (auto i = __numV; i--;)
    {
        //if (coverage[i] == 0) continue;
        degMap[coverage[i]].push_back(i);
    }
    Nodelist sortedNode(__numV); // sortedNode: record the sorted nodes in ascending order of degree
    Nodelist nodePosition(__numV); // nodePosition: record the position of each node in the sortedNode
    Nodelist degreePosition(maxDeg + 2); // degreePosition: the start position of each degree in sortedNode
    uint32_t idxSort = 0;
    size_t idxDegree = 0;
    for (auto& nodes : degMap)
    {
        degreePosition[idxDegree + 1] = degreePosition[idxDegree] + (uint32_t)nodes.size();
        idxDegree++;
        for (auto& node : nodes)
        {
            nodePosition[node] = idxSort;
            sortedNode[idxSort++] = node;
        }
    }
    // check if an edge is removed
    std::vector<bool> edgeMark(__numRRsets, false);
    // record the total of top-k marginal gains
    size_t sumTopk = 0;
    for (auto deg = maxDeg + 1; deg--;)
    {
        if (degreePosition[deg] <= __numV - targetSize)
        {
            sumTopk += deg * (degreePosition[deg + 1] - (__numV - targetSize));
            break;
        }
        sumTopk += deg * (degreePosition[deg + 1] - degreePosition[deg]);
    }
    __boundMin = 1.0 * sumTopk;
    __vecSeed.clear();
    size_t sumInf = 0;
    /*
    * sortedNode: position -> node
    * nodePosition: node -> position
    * degreePosition: degree -> position (start position of this degree)
    * coverage: node -> degree
    * e.g., swap the position of a node with the start position of its degree
    * swap(sortedNode[nodePosition[node]], sortedNode[degreePosition[coverage[node]]])
    */
    for (auto k = targetSize; k--;)
    {
        const auto seed = sortedNode.back();
        sortedNode.pop_back();
        const auto newNumV = sortedNode.size();
        sumTopk += coverage[sortedNode[newNumV - targetSize]] - coverage[seed];
        sumInf += coverage[seed];
        __vecSeed.push_back(seed);
        coverage[seed] = 0;
        for (auto edgeIdx : __hyperG._FRsets[seed])
        {
            if (edgeMark[edgeIdx]) continue;
            edgeMark[edgeIdx] = true;
            for (auto nodeIdx : __hyperG._RRsets[edgeIdx])
            {
                if (coverage[nodeIdx] == 0) continue; // This node is seed, skip
                const auto currPos = nodePosition[nodeIdx]; // The current position
                const auto currDeg = coverage[nodeIdx]; // The current degree
                const auto startPos = degreePosition[currDeg]; // The start position of this degree
                const auto startNode = sortedNode[startPos]; // The node with the start position
                // Swap this node to the start position with the same degree, and update their positions in nodePosition
                std::swap(sortedNode[currPos], sortedNode[startPos]);
                nodePosition[nodeIdx] = startPos;
                nodePosition[startNode] = currPos;
                // Increase the start position of this degree by 1, and decrease the degree of this node by 1
                degreePosition[currDeg]++;
                coverage[nodeIdx]--;
                // If the start position of this degree is in top-k, reduce topk by 1
                if (startPos >= newNumV - targetSize) sumTopk--;
            }
        }
        __boundLast = 1.0 * (sumInf + sumTopk);
        if (__boundMin > __boundLast) __boundMin = __boundLast;
    }
    __boundMin *= 1.0 * __numV / __numRRsets;
    __boundLast *= 1.0 * __numV / __numRRsets;
    const auto finalInf = 1.0 * sumInf * __numV / __numRRsets;
    std::cout << "  >>>[greedy-topk] influence: " << finalInf << ", min-bound: " << __boundMin <<
              ", last-bound: " << __boundLast << '\n';
    return finalInf;
}